

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O2

int duckdb::ResultArrowArrayStreamWrapper::MyStreamGetNext(ArrowArrayStream *stream,ArrowArray *out)

{
  void *pvVar1;
  idx_t batch_size;
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  extension_type_cast;
  bool bVar2;
  type this;
  type scan_state;
  ErrorData *pEVar3;
  StreamQueryResult *this_00;
  int iVar4;
  idx_t result_count;
  ClientProperties local_118;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_e8;
  ErrorData error;
  
  iVar4 = -1;
  if (stream->release != (_func_void_ArrowArrayStream_ptr *)0x0) {
    pvVar1 = stream->private_data;
    this = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)((long)pvVar1 + 0x28));
    scan_state = unique_ptr<duckdb::ChunkScanState,_std::default_delete<duckdb::ChunkScanState>,_true>
                 ::operator*((unique_ptr<duckdb::ChunkScanState,_std::default_delete<duckdb::ChunkScanState>,_true>
                              *)((long)pvVar1 + 0xe8));
    bVar2 = BaseQueryResult::HasError(&this->super_BaseQueryResult);
    if (bVar2) {
      pEVar3 = BaseQueryResult::GetErrorObject(&this->super_BaseQueryResult);
      ErrorData::operator=((ErrorData *)((long)pvVar1 + 0x30),pEVar3);
    }
    else {
      if ((this->super_BaseQueryResult).type == STREAM_RESULT) {
        this_00 = QueryResult::Cast<duckdb::StreamQueryResult>(this);
        bVar2 = StreamQueryResult::IsOpen(this_00);
        if (!bVar2) {
          out->release = (_func_void_ArrowArray_ptr *)0x0;
          return 0;
        }
      }
      if (*(long *)((long)pvVar1 + 0xb8) == *(long *)((long)pvVar1 + 0xc0)) {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   ((long)pvVar1 + 0xb8),
                   &(this->super_BaseQueryResult).types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)pvVar1 + 0xd0),
                    &(this->super_BaseQueryResult).names.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
      }
      ErrorData::ErrorData(&error);
      ClientProperties::ClientProperties(&local_118,&this->client_properties);
      batch_size = *(idx_t *)((long)pvVar1 + 0xb0);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(&local_e8,
                   (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)pvVar1 + 0xf0));
      extension_type_cast._M_h._M_bucket_count = result_count;
      extension_type_cast._M_h._M_buckets = (__buckets_ptr)&local_e8;
      extension_type_cast._M_h._16_40_ = local_118._0_40_;
      bVar2 = ArrowUtil::TryFetchChunk
                        (scan_state,&local_118,batch_size,out,&result_count,&error,
                         extension_type_cast);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_e8);
      ::std::__cxx11::string::~string((string *)&local_118);
      if (bVar2) {
        iVar4 = 0;
        if (result_count == 0) {
          out->release = (_func_void_ArrowArray_ptr *)0x0;
        }
      }
      else {
        ErrorData::operator=((ErrorData *)((long)pvVar1 + 0x30),&error);
        iVar4 = -1;
      }
      ErrorData::~ErrorData(&error);
    }
  }
  return iVar4;
}

Assistant:

int ResultArrowArrayStreamWrapper::MyStreamGetNext(struct ArrowArrayStream *stream, struct ArrowArray *out) {
	if (!stream->release) {
		return -1;
	}
	auto my_stream = reinterpret_cast<ResultArrowArrayStreamWrapper *>(stream->private_data);
	auto &result = *my_stream->result;
	auto &scan_state = *my_stream->scan_state;
	if (result.HasError()) {
		my_stream->last_error = result.GetErrorObject();
		return -1;
	}
	if (result.type == QueryResultType::STREAM_RESULT) {
		auto &stream_result = result.Cast<StreamQueryResult>();
		if (!stream_result.IsOpen()) {
			// Nothing to output
			out->release = nullptr;
			return 0;
		}
	}
	if (my_stream->column_types.empty()) {
		my_stream->column_types = result.types;
		my_stream->column_names = result.names;
	}
	idx_t result_count;
	ErrorData error;
	if (!ArrowUtil::TryFetchChunk(scan_state, result.client_properties, my_stream->batch_size, out, result_count, error,
	                              my_stream->extension_types)) {
		D_ASSERT(error.HasError());
		my_stream->last_error = error;
		return -1;
	}
	if (result_count == 0) {
		// Nothing to output
		out->release = nullptr;
	}
	return 0;
}